

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O2

void __thiscall adios2::core::Attribute<unsigned_long>::~Attribute(Attribute<unsigned_long> *this)

{
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_00819550;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_DataArray).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  AttributeBase::~AttributeBase(&this->super_AttributeBase);
  return;
}

Assistant:

~Attribute() = default;